

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dict.c
# Opt level: O2

REF_STATUS ref_dict_deep_copy(REF_DICT *ref_dict_ptr,REF_DICT original)

{
  uint uVar1;
  int iVar2;
  REF_DICT pRVar3;
  REF_INT *pRVar4;
  REF_INT *pRVar5;
  REF_INT RVar6;
  REF_INT RVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  size_t __size;
  undefined8 uStack_30;
  
  pRVar3 = (REF_DICT)malloc(0x20);
  *ref_dict_ptr = pRVar3;
  if (pRVar3 == (REF_DICT)0x0) {
    pcVar9 = "malloc *ref_dict_ptr of REF_DICT_STRUCT NULL";
    uStack_30 = 0x39;
  }
  else {
    uVar1 = original->n;
    pRVar3->n = uVar1;
    iVar2 = original->max;
    pRVar3->max = iVar2;
    if ((long)iVar2 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",0x40,
             "ref_dict_deep_copy","malloc ref_dict->key of REF_INT negative");
      return 1;
    }
    __size = (long)iVar2 << 2;
    pRVar4 = (REF_INT *)malloc(__size);
    pRVar3->key = pRVar4;
    if (pRVar4 == (REF_INT *)0x0) {
      pcVar9 = "malloc ref_dict->key of REF_INT NULL";
      uStack_30 = 0x40;
    }
    else {
      pRVar5 = (REF_INT *)malloc(__size);
      pRVar3->value = pRVar5;
      if (pRVar5 != (REF_INT *)0x0) {
        RVar6 = -1;
        RVar7 = -1;
        if (0 < (int)uVar1) {
          RVar6 = *original->key;
          RVar7 = *original->value;
        }
        uVar8 = 0;
        if (0 < (int)uVar1) {
          uVar8 = (ulong)uVar1;
        }
        for (lVar10 = 1; lVar10 - uVar8 != 1; lVar10 = lVar10 + 1) {
          pRVar4[lVar10 + -1] = RVar6;
          pRVar5[lVar10 + -1] = RVar7;
          RVar6 = -1;
          RVar7 = -1;
          if ((int)lVar10 < (int)uVar1) {
            RVar6 = original->key[lVar10];
            RVar7 = original->value[lVar10];
          }
        }
        return 0;
      }
      pcVar9 = "malloc ref_dict->value of REF_INT NULL";
      uStack_30 = 0x41;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",uStack_30,
         "ref_dict_deep_copy",pcVar9);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_dict_deep_copy(REF_DICT *ref_dict_ptr,
                                      REF_DICT original) {
  REF_DICT ref_dict;
  REF_INT key_index, dict_key, dict_value;

  ref_malloc(*ref_dict_ptr, 1, REF_DICT_STRUCT);

  ref_dict = (*ref_dict_ptr);

  ref_dict_n(ref_dict) = ref_dict_n(original);
  ref_dict_max(ref_dict) = ref_dict_max(original);

  ref_malloc(ref_dict->key, ref_dict_max(ref_dict), REF_INT);
  ref_malloc(ref_dict->value, ref_dict_max(ref_dict), REF_INT);

  each_ref_dict_key_value(original, key_index, dict_key, dict_value) {
    ref_dict_key(ref_dict, key_index) = dict_key;
    ref_dict_keyvalue(ref_dict, key_index) = dict_value;
  }

  return REF_SUCCESS;
}